

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrolling_group.cpp
# Opt level: O0

int scroll_clip_width_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  int extra_width;
  Am_Widget_Look local_2c;
  Am_Widget_Look look;
  Am_Object v_scroller;
  int group_width;
  int borderwidth;
  Am_Object *self_local;
  
  iVar2 = get_scroll_border_thickness(self);
  pAVar4 = Am_Object::Get(self,0x66,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  self_local._4_4_ = iVar3 + iVar2 * -2;
  pAVar4 = Am_Object::Get(self,0x18b,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar4);
  if (bVar1) {
    Am_Object::Get_Object((Am_Object *)&stack0xffffffffffffffd8,(Am_Slot_Key)self,0x1c4);
    pAVar4 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffd8,0x17f,0);
    Am_Widget_Look::Am_Widget_Look(&local_2c,pAVar4);
    bVar1 = Am_Widget_Look::operator==(&local_2c,&Am_MOTIF_LOOK);
    pAVar4 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffd8,0x66,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar4);
    self_local._4_4_ = (self_local._4_4_ - iVar2) + (uint)bVar1 * 4 + -2;
    Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffd8);
  }
  return self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, scroll_clip_width)
{
  int borderwidth = 2 * get_scroll_border_thickness(self);
  int group_width = (int)self.Get(Am_WIDTH) - borderwidth;
  if ((bool)self.Get(Am_V_SCROLL_BAR)) {
    Am_Object v_scroller = self.Get_Object(Am_V_SCROLLER);
    Am_Widget_Look look = v_scroller.Get(Am_WIDGET_LOOK);
    int extra_width = (look == Am_MOTIF_LOOK) ? 4 : 0;
    return group_width - (int)v_scroller.Get(Am_WIDTH) + extra_width -
           SCROLL_MARGIN;
  } else
    return group_width;
}